

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::sr::anon_unknown_0::ShaderOperatorCase::createInstance
          (ShaderOperatorCase *this,Context *context)

{
  float fVar1;
  float fVar2;
  ShaderRenderCaseInstance *this_00;
  int rowNdx;
  int rowNdx_00;
  int inputNdx;
  BaseAttributeType type;
  long lVar3;
  Vector<float,_4> local_f8;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *local_e8;
  undefined1 *local_e0;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [16];
  _func_int **local_b8;
  Context *pCStack_b0;
  undefined8 local_a8;
  SparseContext *pSStack_a0;
  undefined8 local_98;
  Allocator *pAStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Mat4 attribMatrix;
  
  this_00 = (ShaderRenderCaseInstance *)operator_new(0x250);
  local_b8 = *(_func_int ***)&this->m_spec;
  pCStack_b0 = *(Context **)&(this->m_spec).referenceScale;
  local_a8._0_4_ = (this->m_spec).precision;
  local_a8._4_4_ = (this->m_spec).output;
  pSStack_a0 = *(SparseContext **)&(this->m_spec).numInputs;
  local_98._0_4_ = (this->m_spec).inputs[0].rangeMin;
  local_98._4_4_ = (this->m_spec).inputs[0].rangeMax;
  pAStack_90 = *(Allocator **)((this->m_spec).inputs + 1);
  local_88 = *(undefined8 *)&(this->m_spec).inputs[1].rangeMax;
  uStack_80._0_4_ = (this->m_spec).inputs[2].rangeMin;
  uStack_80._4_4_ = (this->m_spec).inputs[2].rangeMax;
  ShaderRenderCaseInstance::ShaderRenderCaseInstance
            (this_00,context,(this->super_ShaderRenderCase).m_isVertexCase,
             (this->super_ShaderRenderCase).m_evaluator.
             super_UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
             .m_data.ptr,
             (this->super_ShaderRenderCase).m_uniformSetup.
             super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
             .m_data.ptr,(AttributeSetupFunc)0x0,IMAGE_BACKING_MODE_REGULAR,0);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00bfff20;
  this_00[1].m_imageBackingMode = (undefined4)local_a8;
  this_00[1].m_quadGridSize = local_a8._4_4_;
  this_00[1].m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = pSStack_a0;
  this_00[1].super_TestInstance._vptr_TestInstance = local_b8;
  this_00[1].super_TestInstance.m_context = pCStack_b0;
  *(undefined8 *)
   &this_00[1].m_sparseContext.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
    .m_data.field_0x8 = local_98;
  this_00[1].m_memAlloc = pAStack_90;
  *(undefined8 *)this_00[1].m_clearColor.m_data = local_88;
  *(undefined8 *)(this_00[1].m_clearColor.m_data + 2) = uStack_80;
  local_e8 = &this_00->m_userAttribTransforms;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (local_e8,(long)*(int *)&this_00[1].m_sparseContext.
                                     super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                                     .m_data.ptr);
  local_e0 = (undefined1 *)
             ((long)&this_00[1].m_sparseContext.
                     super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                     .m_data.ptr + 4);
  lVar3 = 0;
  do {
    if (*(int *)&this_00[1].m_sparseContext.
                 super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                 .m_data.ptr <= lVar3) {
      return &this_00->super_TestInstance;
    }
    fVar1 = *(float *)(local_e0 + lVar3 * 0xc + 4);
    fVar2 = *(float *)(local_e0 + lVar3 * 0xc + 8);
    tcu::Matrix<float,_4,_4>::Matrix(&attribMatrix);
    local_c8 = ZEXT416((uint)(fVar2 - fVar1));
    local_d8 = -(fVar2 - fVar1);
    uStack_d4 = 0x80000000;
    uStack_d0 = 0x80000000;
    uStack_cc = 0x80000000;
    for (rowNdx_00 = 0; type = (BaseAttributeType)lVar3, rowNdx_00 != 4; rowNdx_00 = rowNdx_00 + 1)
    {
      tcu::Vector<float,_4>::Vector(&local_f8);
      switch((long)(int)(type + rowNdx_00) % 4 & 0xffffffff) {
      case 0:
        local_f8.m_data[0] = (float)local_c8._0_4_;
        local_f8.m_data[1] = 0.0;
        local_f8.m_data[3] = fVar1;
        break;
      case 1:
        local_f8.m_data[0] = 0.0;
        local_f8.m_data[1] = (float)local_c8._0_4_;
        local_f8.m_data[3] = fVar1;
        break;
      case 2:
        local_f8.m_data[0] = local_d8;
        local_f8.m_data[1] = 0.0;
        local_f8.m_data[3] = fVar2;
        break;
      case 3:
        local_f8.m_data[0] = 0.0;
        local_f8.m_data[1] = local_d8;
        local_f8.m_data[3] = fVar2;
        break;
      default:
        goto switchD_005d9240_default;
      }
      local_f8.m_data[2] = 0.0;
switchD_005d9240_default:
      tcu::Matrix<float,_4,_4>::setRow(&attribMatrix,rowNdx_00,&local_f8);
    }
    tcu::Matrix<float,_4,_4>::operator=
              ((local_e8->
               super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
               )._M_impl.super__Vector_impl_data._M_start + lVar3,&attribMatrix);
    if (type < MAT2) {
      ShaderRenderCaseInstance::useAttribute(this_00,type | MAT2,type);
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

TestInstance* ShaderOperatorCase::createInstance (Context& context) const
{
	DE_ASSERT(m_evaluator != DE_NULL);
	DE_ASSERT(m_uniformSetup != DE_NULL);
	return new ShaderOperatorCaseInstance(context, m_isVertexCase, *m_evaluator, *m_uniformSetup, m_spec);
}